

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::suppresssteinerpoints(tetgenmesh *this)

{
  uint uVar1;
  int iVar2;
  point searchpt;
  long lVar3;
  char **ppcVar4;
  long lVar5;
  double dVar6;
  int iVar7;
  arraypool *paVar8;
  uint uVar9;
  tetgenbehavior *ptVar10;
  int iVar11;
  tetgenmesh *this_00;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double local_a8;
  optparameters local_68;
  
  ptVar10 = this->b;
  if (ptVar10->quiet == 0) {
    puts("Suppressing Steiner points ...");
    ptVar10 = this->b;
  }
  iVar13 = ptVar10->fliplinklevel;
  ptVar10->fliplinklevel = 100000;
  paVar8 = this->subvertstack;
  if (0 < paVar8->objects) {
    lVar15 = 0;
    iVar11 = 0;
    do {
      if ((*(uint *)((long)*(point *)(paVar8->toparray
                                      [(uint)lVar15 >> ((byte)paVar8->log2objectsperblock & 0x1f)] +
                                     (long)paVar8->objectbytes *
                                     (long)(int)(paVar8->objectsperblockmark & (uint)lVar15)) +
                    (long)this->pointmarkindex * 4 + 4) & 0xfffffe00) == 0x600) {
        iVar7 = suppressbdrysteinerpoint
                          (this,*(point *)(paVar8->toparray
                                           [(uint)lVar15 >>
                                            ((byte)paVar8->log2objectsperblock & 0x1f)] +
                                          (long)paVar8->objectbytes *
                                          (long)(int)(paVar8->objectsperblockmark & (uint)lVar15)));
        iVar11 = iVar11 + iVar7;
        paVar8 = this->subvertstack;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < paVar8->objects);
    ptVar10 = this->b;
    if ((0 < iVar11) && (ptVar10->verbose != 0)) {
      printf("  Suppressed %d boundary Steiner points.\n");
      ptVar10 = this->b;
      paVar8 = this->subvertstack;
    }
  }
  if ((0 < ptVar10->supsteiner_level) && (0 < paVar8->objects)) {
    lVar15 = 0;
    iVar11 = 0;
    do {
      if ((*(uint *)((long)*(point *)(paVar8->toparray
                                      [(uint)lVar15 >> ((byte)paVar8->log2objectsperblock & 0x1f)] +
                                     (long)paVar8->objectbytes *
                                     (long)(int)(paVar8->objectsperblockmark & (uint)lVar15)) +
                    (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0x800) {
        iVar7 = removevertexbyflips(this,*(point *)(paVar8->toparray
                                                    [(uint)lVar15 >>
                                                     ((byte)paVar8->log2objectsperblock & 0x1f)] +
                                                   (long)paVar8->objectbytes *
                                                   (long)(int)(paVar8->objectsperblockmark &
                                                              (uint)lVar15)));
        iVar11 = iVar11 + iVar7;
        paVar8 = this->subvertstack;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < paVar8->objects);
    ptVar10 = this->b;
    if ((0 < iVar11) && (ptVar10->verbose != 0)) {
      printf("  Removed %d interior Steiner points.\n");
      ptVar10 = this->b;
      paVar8 = this->subvertstack;
    }
  }
  ptVar10->fliplinklevel = iVar13;
  if (1 < ptVar10->supsteiner_level) {
    iVar7 = 0;
    local_68.min_max_dihedangle = 0;
    local_68.initval = 0.0;
    local_68.imprval = 0.0;
    local_68.smthiter = 0;
    local_68.max_min_volume = 1;
    local_68.min_max_aspectratio = 0;
    iVar13 = 0x1e;
    uVar17 = 0xd2f1a9fc;
    uVar18 = 0x3f50624d;
    iVar11 = 0x14;
    do {
      local_68.searchstep = (double)CONCAT44(uVar18,uVar17);
      local_68.numofsearchdirs = iVar11;
      local_68.maxiter = iVar13;
      uVar9 = 0;
      do {
        if (paVar8->objects < 1) goto LAB_00142005;
        lVar15 = 0;
        iVar12 = 0;
        iVar13 = 0;
        do {
          searchpt = *(point *)(paVar8->toparray
                                [(uint)lVar15 >> ((byte)paVar8->log2objectsperblock & 0x1f)] +
                               (long)paVar8->objectbytes *
                               (long)(int)(paVar8->objectsperblockmark & (uint)lVar15));
          if ((*(uint *)((long)searchpt + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0x800
             ) {
            this_00 = this;
            getvertexstar(this,1,searchpt,this->cavetetlist,(arraypool *)0x0,(arraypool *)0x0);
            paVar8 = this->cavetetlist;
            lVar3 = paVar8->objects;
            local_a8 = local_68.initval;
            if (0 < lVar3) {
              ppcVar4 = paVar8->toparray;
              iVar11 = paVar8->log2objectsperblock;
              uVar1 = paVar8->objectsperblockmark;
              iVar2 = paVar8->objectbytes;
              lVar14 = 0;
              do {
                lVar5 = *(long *)(ppcVar4[(uint)lVar14 >> ((byte)iVar11 & 0x1f)] +
                                 (long)(int)((uint)lVar14 & uVar1) * (long)iVar2);
                dVar6 = orient3dfast(this_00,*(double **)(lVar5 + 0x28),*(double **)(lVar5 + 0x20),
                                     *(double **)(lVar5 + 0x30),*(double **)(lVar5 + 0x38));
                if ((lVar14 == 0) || (dVar6 < local_a8)) {
                  local_a8 = dVar6;
                }
                lVar14 = lVar14 + 1;
              } while (lVar3 != lVar14);
            }
            local_68.initval = local_a8;
            iVar11 = smoothpoint(this,searchpt,paVar8,1,&local_68);
            iVar13 = (iVar13 + 1) - (uint)(iVar11 == 0);
            iVar12 = (iVar12 + 1) - (uint)(0.0 < local_68.imprval);
            this->cavetetlist->objects = 0;
            paVar8 = this->subvertstack;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < paVar8->objects);
        iVar7 = iVar7 + iVar13;
      } while ((iVar13 != 0) && (bVar16 = uVar9 < 2, uVar9 = uVar9 + 1, bVar16));
      if (iVar12 < 1) break;
      iVar13 = -1;
      iVar11 = 0x1e;
      uVar17 = 0xeb1c432d;
      uVar18 = 0x3f1a36e2;
    } while (0 < local_68.maxiter);
    if (0 < iVar12) {
      puts("BUG Report!  The mesh contain inverted elements.");
    }
LAB_00142005:
    if ((this->b->verbose != 0) && (0 < iVar7)) {
      printf("  Smoothed %d Steiner points.\n");
    }
    paVar8 = this->subvertstack;
  }
  paVar8->objects = 0;
  return 1;
}

Assistant:

int tetgenmesh::suppresssteinerpoints()
{

  if (!b->quiet) {
    printf("Suppressing Steiner points ...\n");
  }

  point rempt, *parypt;

  int bak_fliplinklevel = b->fliplinklevel;
  b->fliplinklevel = 100000; // Unlimited flip level.
  int suppcount = 0, remcount = 0;
  int i;

  // Try to suppress boundary Steiner points.
  for (i = 0; i < subvertstack->objects; i++) {
    parypt = (point *) fastlookup(subvertstack, i);
    rempt = *parypt;
    if (pointtype(rempt) != UNUSEDVERTEX) {
      if ((pointtype(rempt) == FREESEGVERTEX) || 
          (pointtype(rempt) == FREEFACETVERTEX)) {
        if (suppressbdrysteinerpoint(rempt)) {
          suppcount++;
        }
      }
    }
  } // i

  if (suppcount > 0) {
    if (b->verbose) {
      printf("  Suppressed %d boundary Steiner points.\n", suppcount);
    }
  }

  if (b->supsteiner_level > 0) { // -Y/1
    for (i = 0; i < subvertstack->objects; i++) {
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (pointtype(rempt) != UNUSEDVERTEX) {
        if (pointtype(rempt) == FREEVOLVERTEX) {
          if (removevertexbyflips(rempt)) {
            remcount++;
          }
        }
      }
    }
  }

  if (remcount > 0) {
    if (b->verbose) {
      printf("  Removed %d interior Steiner points.\n", remcount);
    }
  }

  b->fliplinklevel = bak_fliplinklevel;

  if (b->supsteiner_level > 1) { // -Y/2
    // Smooth interior Steiner points.
    optparameters opm;
    triface *parytet;
    point *ppt;
    REAL ori;
    int smtcount, count, ivcount;
    int nt, j;

    // Point smooth options.
    opm.max_min_volume = 1;
    opm.numofsearchdirs = 20;
    opm.searchstep = 0.001;
    opm.maxiter = 30; // Limit the maximum iterations.

    smtcount = 0;

    do {

      nt = 0;

      while (1) {
        count = 0;
        ivcount = 0; // Clear the inverted count.

        for (i = 0; i < subvertstack->objects; i++) {
          parypt = (point *) fastlookup(subvertstack, i);
          rempt = *parypt;
          if (pointtype(rempt) == FREEVOLVERTEX) {
            getvertexstar(1, rempt, cavetetlist, NULL, NULL);
            // Calculate the initial smallest volume (maybe zero or negative).
            for (j = 0; j < cavetetlist->objects; j++) {
              parytet = (triface *) fastlookup(cavetetlist, j);
              ppt = (point *) &(parytet->tet[4]);
              ori = orient3dfast(ppt[1], ppt[0], ppt[2], ppt[3]);
              if (j == 0) {
                opm.initval = ori;
              } else {
                if (opm.initval > ori) opm.initval = ori; 
              }
            }
            if (smoothpoint(rempt, cavetetlist, 1, &opm)) {
              count++;
            }
            if (opm.imprval <= 0.0) {
              ivcount++; // The mesh contains inverted elements.
            }
            cavetetlist->restart();
          }
        } // i

        smtcount += count;

        if (count == 0) {
          // No point has been smoothed.
          break;
        }

        nt++;
        if (nt > 2) {
          break; // Already three iterations.
        }
      } // while

      if (ivcount > 0) {
        // There are inverted elements!
        if (opm.maxiter > 0) {
          // Set unlimited smoothing steps. Try again.
          opm.numofsearchdirs = 30;
          opm.searchstep = 0.0001;
          opm.maxiter = -1;
          continue;
        }
      }

      break;
    } while (1); // Additional loop for (ivcount > 0)

    if (ivcount > 0) {
      printf("BUG Report!  The mesh contain inverted elements.\n");
    }

    if (b->verbose) {
      if (smtcount > 0) {
        printf("  Smoothed %d Steiner points.\n", smtcount); 
      }
    }
  } // -Y2

  subvertstack->restart();

  return 1;
}